

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

ByteArray *
ot::commissioner::CommissionerImpl::GetNetDiagTlvTypes
          (ByteArray *__return_storage_ptr__,uint64_t aDiagDataFlags)

{
  uint64_t aDiagDataFlags_local;
  ByteArray *tlvTypes;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if ((aDiagDataFlags & 1) != 0) {
    EncodeTlvType(__return_storage_ptr__,kChannel);
  }
  if ((aDiagDataFlags & 2) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagMacAddress);
  }
  if ((aDiagDataFlags & 4) != 0) {
    EncodeTlvType(__return_storage_ptr__,kExtendedPanId);
  }
  if ((aDiagDataFlags & 8) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagRoute64);
  }
  if ((aDiagDataFlags & 0x10) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagLeaderData);
  }
  if ((aDiagDataFlags & 0x20) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagIpv6Address);
  }
  if ((aDiagDataFlags & 0x100) != 0) {
    EncodeTlvType(__return_storage_ptr__,kBorderAgentLocator);
  }
  if ((aDiagDataFlags & 0x40) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagChildTable);
  }
  if ((aDiagDataFlags & 0x80) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagEui64);
  }
  if ((aDiagDataFlags & 0x200) != 0) {
    EncodeTlvType(__return_storage_ptr__,kNetworkDiagChildIpv6Address);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray CommissionerImpl::GetNetDiagTlvTypes(uint64_t aDiagDataFlags)
{
    ByteArray tlvTypes;

    if (aDiagDataFlags & NetDiagData::kExtMacAddrBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagExtMacAddress);
    }

    if (aDiagDataFlags & NetDiagData::kMacAddrBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagMacAddress);
    }

    if (aDiagDataFlags & NetDiagData::kModeBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagMode);
    }

    if (aDiagDataFlags & NetDiagData::kRoute64Bit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagRoute64);
    }

    if (aDiagDataFlags & NetDiagData::kLeaderDataBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagLeaderData);
    }

    if (aDiagDataFlags & NetDiagData::kAddrsBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagIpv6Address);
    }

    if (aDiagDataFlags & NetDiagData::kMacCountersBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagMacCounters);
    }

    if (aDiagDataFlags & NetDiagData::kChildTableBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagChildTable);
    }

    if (aDiagDataFlags & NetDiagData::kEui64Bit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagEui64);
    }

    if (aDiagDataFlags & NetDiagData::kChildIpv6AddrsInfoListBit)
    {
        EncodeTlvType(tlvTypes, tlv::Type::kNetworkDiagChildIpv6Address);
    }

    return tlvTypes;
}